

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O0

uint32_t Ngram_bow(Ngram model,uint32_t *gram_words,uint32_t gram_len)

{
  uint uVar1;
  uint32_t uVar2;
  uint local_3c;
  uint local_38;
  uint32_t j;
  uint32_t ngram_idx;
  uint32_t next;
  uint32_t next_word_end;
  uint32_t next_word_start;
  uint32_t cur_word_id;
  uint32_t gram_len_local;
  uint32_t *gram_words_local;
  Ngram model_local;
  
  uVar1 = *gram_words;
  next = model->uni_gram[uVar1].next_arr_idx;
  ngram_idx = model->uni_gram[uVar1 + 1].next_arr_idx;
  if (gram_len == 1) {
    model_local._4_4_ = model->uni_gram[uVar1].bow;
  }
  else if (gram_len < model->ngram_order) {
    j = 0xffffffff;
    local_38 = 0;
    for (local_3c = 1; local_3c < gram_len; local_3c = local_3c + 1) {
      uVar2 = search_low_gram(gram_words[local_3c],model->low_grams[local_38] + next,
                              (ulong)(ngram_idx - next));
      j = uVar2 + next;
      if (local_3c == gram_len - 1) {
        return model->low_grams[local_38][j].bow;
      }
      if (j == 0xffffffff) {
        return 0xffffffff;
      }
      next = model->low_grams[local_38][j].next_arr_idx;
      ngram_idx = model->low_grams[local_38][j + 1].next_arr_idx;
      local_38 = local_38 + 1;
    }
    model_local._4_4_ = model->low_grams[local_38][j].bow;
  }
  else {
    model_local._4_4_ = 0;
  }
  return model_local._4_4_;
}

Assistant:

uint32_t Ngram_bow(const Ngram model, const uint32_t* gram_words, uint32_t gram_len){
    uint32_t cur_word_id = gram_words[0];
    uint32_t next_word_start = model->uni_gram[cur_word_id].next_arr_idx;
    uint32_t next_word_end = model->uni_gram[cur_word_id+1].next_arr_idx;
    if (gram_len == 1) {
        return model->uni_gram[cur_word_id].bow;
    }
    if (gram_len >= model->ngram_order) {
        return 0;
    }
    uint32_t next = -1;
    uint32_t ngram_idx = 0;
    for (uint32_t j = 1; j < gram_len;j++) {
        next = search_low_gram(gram_words[j], model->low_grams[ngram_idx] + next_word_start, next_word_end - next_word_start)+next_word_start; 
        if(j == gram_len -1){
           return model->low_grams[ngram_idx][next].bow;
        }
        if (next == -1) {
            return -1;
        }else{
            next_word_start = model->low_grams[ngram_idx][next].next_arr_idx;
            next_word_end = model->low_grams[ngram_idx][next+1].next_arr_idx;
        }
        ngram_idx+=1;
    }
    return model->low_grams[ngram_idx][next].bow;
}